

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_parsed_ir.cpp
# Opt level: O1

void __thiscall
spirv_cross::ParsedIR::unset_member_decoration
          (ParsedIR *this,TypeID id,uint32_t index,Decoration decoration)

{
  Decoration *pDVar1;
  byte bVar2;
  mapped_type *pmVar3;
  ulong uVar4;
  Decoration local_20;
  key_type local_1c;
  
  local_1c.id = id.id;
  pmVar3 = ::std::__detail::
           _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&this->meta,&local_1c);
  uVar4 = (ulong)index;
  if (uVar4 < (pmVar3->members).super_VectorView<spirv_cross::Meta::Decoration>.buffer_size) {
    pDVar1 = (pmVar3->members).super_VectorView<spirv_cross::Meta::Decoration>.ptr;
    if (decoration < 0x40) {
      bVar2 = (byte)decoration & 0x3f;
      pDVar1[uVar4].decoration_flags.lower =
           pDVar1[uVar4].decoration_flags.lower &
           (-2L << bVar2 | 0xfffffffffffffffeU >> 0x40 - bVar2);
    }
    else {
      local_20 = decoration;
      ::std::
      _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::_M_erase(&pDVar1[uVar4].decoration_flags.higher._M_h,&local_20);
    }
    if ((int)decoration < 0x1d) {
      if (decoration == DecorationSpecId) {
        pDVar1[uVar4].spec_id = 0;
      }
      else if (decoration == DecorationBuiltIn) {
        pDVar1[uVar4].builtin = false;
      }
    }
    else {
      switch(decoration) {
      case DecorationStream:
        pDVar1[uVar4].stream = 0;
        break;
      case DecorationLocation:
        pDVar1[uVar4].location = 0;
        break;
      case DecorationComponent:
        pDVar1[uVar4].component = 0;
        break;
      case DecorationIndex:
      case DecorationBinding:
      case DecorationDescriptorSet:
        break;
      case DecorationOffset:
        pDVar1[uVar4].offset = 0;
        break;
      case DecorationXfbBuffer:
        pDVar1[uVar4].xfb_buffer = 0;
        break;
      case DecorationXfbStride:
        pDVar1[uVar4].xfb_stride = 0;
        break;
      default:
        if (decoration == DecorationHlslSemanticGOOGLE) {
          pDVar1[uVar4].hlsl_semantic._M_string_length = 0;
          *pDVar1[uVar4].hlsl_semantic._M_dataplus._M_p = '\0';
        }
      }
    }
  }
  return;
}

Assistant:

void ParsedIR::unset_member_decoration(TypeID id, uint32_t index, Decoration decoration)
{
	auto &m = meta[id];
	if (index >= m.members.size())
		return;

	auto &dec = m.members[index];

	dec.decoration_flags.clear(decoration);
	switch (decoration)
	{
	case DecorationBuiltIn:
		dec.builtin = false;
		break;

	case DecorationLocation:
		dec.location = 0;
		break;

	case DecorationComponent:
		dec.component = 0;
		break;

	case DecorationOffset:
		dec.offset = 0;
		break;

	case DecorationXfbBuffer:
		dec.xfb_buffer = 0;
		break;

	case DecorationXfbStride:
		dec.xfb_stride = 0;
		break;

	case DecorationStream:
		dec.stream = 0;
		break;

	case DecorationSpecId:
		dec.spec_id = 0;
		break;

	case DecorationHlslSemanticGOOGLE:
		dec.hlsl_semantic.clear();
		break;

	default:
		break;
	}
}